

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O1

Value * __thiscall
duckdb::KeyValueSecret::TryGetValue
          (Value *__return_storage_ptr__,KeyValueSecret *this,string *key,bool error_on_missing)

{
  pointer pcVar1;
  const_iterator cVar2;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  LogicalType local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  cVar2 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::find(&(this->secret_map)._M_t,key);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->secret_map)._M_t._M_impl.super__Rb_tree_header) {
    if (error_on_missing) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Failed to fetch key \'%s\' from secret \'%s\' of type \'%s\'",
                 "");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (key->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + key->_M_string_length);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (this->super_BaseSecret).name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + (this->super_BaseSecret).name._M_string_length)
      ;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar1 = (this->super_BaseSecret).type._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,pcVar1 + (this->super_BaseSecret).type._M_string_length)
      ;
      InternalException::
      InternalException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_00,&local_50,&local_70,&local_90,&local_c8);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_a8,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_a8);
    LogicalType::~LogicalType(&local_a8);
  }
  else {
    Value::Value(__return_storage_ptr__,(Value *)(cVar2._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

Value KeyValueSecret::TryGetValue(const string &key, bool error_on_missing) const {
	auto lookup = secret_map.find(key);
	if (lookup == secret_map.end()) {
		if (error_on_missing) {
			throw InternalException("Failed to fetch key '%s' from secret '%s' of type '%s'", key, name, type);
		}
		return Value();
	}

	return lookup->second;
}